

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::ConstantManager::ConstantManager(ConstantManager *this,IRContext *ctx)

{
  _Rb_tree_header *p_Var1;
  Instruction **inst;
  pointer ppIVar2;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_30
  ;
  
  this->ctx_ = ctx;
  (this->id_to_const_val_)._M_h._M_buckets = &(this->id_to_const_val_)._M_h._M_single_bucket;
  (this->id_to_const_val_)._M_h._M_bucket_count = 1;
  (this->id_to_const_val_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_const_val_)._M_h._M_element_count = 0;
  (this->id_to_const_val_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_const_val_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_const_val_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->const_val_to_id_)._M_t._M_impl.super__Rb_tree_header;
  (this->const_val_to_id_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->const_val_to_id_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->const_val_to_id_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->const_val_to_id_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->const_val_to_id_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->const_pool_)._M_h._M_buckets = &(this->const_pool_)._M_h._M_single_bucket;
  (this->const_pool_)._M_h._M_bucket_count = 1;
  (this->const_pool_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->const_pool_)._M_h._M_element_count = 0;
  (this->const_pool_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->const_pool_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->const_pool_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->owned_constants_).
  super__Vector_base<std::unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->owned_constants_).
  super__Vector_base<std::unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->owned_constants_).
  super__Vector_base<std::unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Module::GetConstants
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_30,
             (ctx->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  for (ppIVar2 = local_30._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 != local_30._M_impl.super__Vector_impl_data._M_finish; ppIVar2 = ppIVar2 + 1) {
    MapInst(this,*ppIVar2);
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_30);
  return;
}

Assistant:

ConstantManager::ConstantManager(IRContext* ctx) : ctx_(ctx) {
  // Populate the constant table with values from constant declarations in the
  // module.  The values of each OpConstant declaration is the identity
  // assignment (i.e., each constant is its own value).
  for (const auto& inst : ctx_->module()->GetConstants()) {
    MapInst(inst);
  }
}